

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::EndFunctionBody
          (BinaryReaderInterp *this,Index index)

{
  pointer *ppLVar1;
  Result RVar2;
  Enum EVar3;
  Index keep_count;
  Index drop_count;
  Location loc;
  u32 local_40;
  u32 local_3c;
  Location local_38;
  
  FixupMap::Resolve(&this->depth_fixups_,this->istream_,
                    (int)((ulong)((long)(this->label_stack_).
                                        super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->label_stack_).
                                       super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1);
  RVar2 = GetReturnDropKeepCount(this,&local_3c,&local_40);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    local_38.field_1.field_0.last_column = 0;
    local_38.filename._M_len = (this->filename_)._M_len;
    local_38.filename._M_str = (this->filename_)._M_str;
    local_38.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    RVar2 = SharedValidator::EndFunctionBody(&this->validator_,&local_38);
    if (RVar2.enum_ != Error) {
      Istream::EmitDropKeep(this->istream_,local_3c,local_40);
      Istream::Emit(this->istream_,Return);
      ppLVar1 = &(this->label_stack_).
                 super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + -1;
      this->func_ = (FuncDesc *)0x0;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::EndFunctionBody(Index index) {
  FixupTopLabel();
  Index drop_count, keep_count;
  CHECK_RESULT(GetReturnDropKeepCount(&drop_count, &keep_count));
  CHECK_RESULT(validator_.EndFunctionBody(GetLocation()));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::Return);
  PopLabel();
  func_ = nullptr;
  return Result::Ok;
}